

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O3

void aom_img_downshift(aom_image_t *dst,aom_image_t *src,int down_shift)

{
  aom_img_fmt_t aVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uchar *puVar12;
  uchar *puVar13;
  long lVar14;
  
  aVar1 = dst->fmt;
  uVar8 = dst->d_w;
  if ((aVar1 >> 0xb & 1) == 0) {
    if ((((uVar8 != src->d_w) || (dst->d_h != src->d_h)) ||
        (dst->x_chroma_shift != src->x_chroma_shift)) ||
       (((dst->y_chroma_shift != src->y_chroma_shift || (down_shift < 0)) ||
        ((src->fmt != (aVar1 | 0x800) ||
         ((1 < aVar1 - AOM_IMG_FMT_I422 && (aVar1 != AOM_IMG_FMT_I420)))))))) {
LAB_001225e5:
      fatal("Unsupported image conversion");
    }
    lVar7 = 0;
    do {
      uVar8 = src->d_w;
      uVar10 = src->d_h;
      if (lVar7 != 0) {
        uVar8 = uVar8 + src->x_chroma_shift >> ((byte)src->x_chroma_shift & 0x1f);
        uVar10 = uVar10 + src->y_chroma_shift >> ((byte)src->y_chroma_shift & 0x1f);
      }
      if (0 < (int)uVar10) {
        uVar11 = 0;
        do {
          if (0 < (int)uVar8) {
            iVar2 = dst->stride[lVar7];
            puVar13 = dst->planes[lVar7];
            iVar3 = src->stride[lVar7];
            puVar12 = src->planes[lVar7];
            lVar14 = 0;
            do {
              puVar13[lVar14 + (int)(iVar2 * uVar11)] =
                   (uchar)(*(ushort *)(puVar12 + lVar14 * 2 + (long)(int)(iVar3 * uVar11)) >>
                          ((byte)down_shift & 0x1f));
              lVar14 = lVar14 + 1;
            } while (uVar8 != (uint)lVar14);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar10);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  else {
    if (((((uVar8 != src->d_w) || (uVar10 = dst->d_h, uVar10 != src->d_h)) ||
         (uVar11 = dst->x_chroma_shift, uVar11 != src->x_chroma_shift)) ||
        ((uVar4 = dst->y_chroma_shift, uVar4 != src->y_chroma_shift || (down_shift < 0)))) ||
       ((aVar1 != src->fmt || ((1 < aVar1 - AOM_IMG_FMT_I42216 && (aVar1 != AOM_IMG_FMT_I42016))))))
    goto LAB_001225e5;
    lVar7 = 0;
    do {
      uVar6 = uVar4 + uVar10 >> ((byte)uVar4 & 0x1f);
      uVar5 = uVar11 + uVar8 >> ((byte)uVar11 & 0x1f);
      if (lVar7 == 0) {
        uVar6 = uVar10;
        uVar5 = uVar8;
      }
      if (0 < (int)uVar6) {
        puVar13 = src->planes[lVar7];
        iVar2 = src->stride[lVar7];
        puVar12 = dst->planes[lVar7];
        iVar3 = dst->stride[lVar7];
        uVar9 = 0;
        do {
          if (0 < (int)uVar5) {
            lVar14 = 0;
            do {
              *(ushort *)(puVar12 + lVar14 * 2) =
                   *(ushort *)(puVar13 + lVar14 * 2) >> ((byte)down_shift & 0x1f);
              lVar14 = lVar14 + 1;
            } while (uVar5 != (uint)lVar14);
          }
          uVar9 = uVar9 + 1;
          puVar12 = puVar12 + iVar3;
          puVar13 = puVar13 + iVar2;
        } while (uVar9 != uVar6);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  return;
}

Assistant:

void aom_img_downshift(aom_image_t *dst, const aom_image_t *src,
                       int down_shift) {
  if (dst->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    highbd_img_downshift(dst, src, down_shift);
  } else {
    lowbd_img_downshift(dst, src, down_shift);
  }
}